

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

string * __thiscall pbrt::TransformedSceneEntity::ToString_abi_cxx11_(TransformedSceneEntity *this)

{
  string *in_RDI;
  FileLoc *in_stack_00000010;
  ParameterDictionary *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&,pbrt::AnimatedTransform_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
             (AnimatedTransform *)this);
  return in_RDI;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ TransformedSeneEntity name: %s parameters: %s loc: %s "
                            "renderFromObject: %s ]",
                            name, parameters, loc, renderFromObject);
    }